

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void runtime::printConstantArray<double>(ostream *out,vector<double,_std::allocator<double>_> *vec)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  char local_31;
  
  pdVar1 = (vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"| |",3);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"| ",2);
      poVar4 = std::ostream::_M_insert<double>(pdVar1[lVar6]);
      local_31 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
      lVar6 = lVar6 + 1;
      lVar3 = lVar5 + 8;
      lVar5 = lVar5 + 8;
    } while ((pointer)((long)pdVar1 + lVar3) != pdVar2);
  }
  return;
}

Assistant:

void printConstantArray(std::ostream & out, const std::vector<T> & vec) {
  std::size_t i = 0;
  for (const auto& val : vec) {
    out << "| |" << i << "| " << val << '\n';
    i++;
  }
}